

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  double dVar1;
  double dVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ImGuiKey IVar9;
  ImGuiAxis axis;
  float fVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  double dVar14;
  
  pIVar3 = GImGui;
  dVar2 = v_max - v_min;
  if ((v_speed == 0.0 && v_min < v_max) && (dVar2 < 3.4028234663852886e+38)) {
    v_speed = (float)((double)GImGui->DragSpeedDefaultRatio * dVar2);
  }
  axis = (flags & 0x100000U) >> 0x14;
  uVar6 = data_type & 0xfffffffe;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar4 = IsMousePosValid((ImVec2 *)0x0), bVar4)) &&
     (bVar4 = IsMouseDragPastThreshold(0,(pIVar3->IO).MouseDragThreshold * 0.5), bVar4)) {
    fVar13 = *(float *)((pIVar3->IO).MouseDown + (ulong)(uint)axis * 4 + -0x18);
    if ((pIVar3->IO).KeyAlt != false) {
      fVar13 = fVar13 * 0.01;
    }
    if ((pIVar3->IO).KeyShift == true) {
      fVar13 = fVar13 * 10.0;
    }
  }
  else {
    fVar13 = 0.0;
    if ((pIVar3->ActiveIdSource & ~ImGuiInputSource_Mouse) == ImGuiInputSource_Keyboard) {
      uVar7 = 0;
      if (uVar6 == 8) {
        uVar7 = ImParseFormatPrecision(format,3);
      }
      IVar9 = ImGuiKey_ModCtrl;
      if (pIVar3->NavInputSource == ImGuiInputSource_Gamepad) {
        IVar9 = ImGuiKey_GamepadL1;
      }
      bVar4 = IsKeyDown(IVar9);
      IVar9 = ImGuiKey_ModShift;
      if (pIVar3->NavInputSource == ImGuiInputSource_Gamepad) {
        IVar9 = ImGuiKey_GamepadR1;
      }
      bVar5 = IsKeyDown(IVar9);
      if (bVar5) {
        fVar11 = 10.0;
      }
      else {
        fVar11 = 1.0;
      }
      if (bVar4) {
        fVar11 = 0.1;
      }
      fVar13 = GetNavTweakPressedAmount(axis);
      if ((int)uVar7 < 0) {
        fVar10 = 1.1754944e-38;
      }
      else if ((int)uVar7 < 10) {
        fVar10 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar7 * 4);
      }
      else {
        fVar10 = powf(10.0,(float)(int)-uVar7);
      }
      fVar13 = fVar13 * fVar11;
      v_speed = (float)((uint)v_speed & -(uint)(fVar10 <= v_speed) |
                       ~-(uint)(fVar10 <= v_speed) & (uint)fVar10);
    }
  }
  fVar13 = fVar13 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar13 = -fVar13;
  }
  if ((((flags & 0x20U) != 0) && (dVar2 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar2)) {
    fVar13 = fVar13 / (float)dVar2;
  }
  if (v_min < v_max && (flags & 0x100U) == 0) {
    if ((*v < v_max) || (bVar4 = true, fVar13 <= 0.0)) {
      bVar4 = fVar13 < 0.0 && *v <= v_min;
    }
  }
  else {
    bVar4 = false;
  }
  if ((pIVar3->ActiveIdIsJustActivated != false) || (bVar4)) {
    pIVar3->DragCurrentAccum = 0.0;
    bVar4 = false;
  }
  else {
    if ((fVar13 == 0.0) && (!NAN(fVar13))) goto LAB_001d5d62;
    pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum + fVar13;
    bVar4 = true;
  }
  pIVar3->DragCurrentAccumDirty = bVar4;
LAB_001d5d62:
  if (pIVar3->DragCurrentAccumDirty == true) {
    dVar14 = *v;
    if ((flags & 0x20U) == 0) {
      dVar14 = dVar14 + (double)pIVar3->DragCurrentAccum;
      fVar11 = 0.0;
      dVar1 = 0.0;
    }
    else {
      if (uVar6 == 8) {
        iVar8 = ImParseFormatPrecision(format,3);
        fVar11 = (float)iVar8;
      }
      else {
        fVar11 = 1.0;
      }
      fVar11 = powf(0.1,fVar11);
      fVar10 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar14,v_min,v_max,true,fVar11,0.0);
      dVar14 = ScaleValueFromRatioT<double,double,double>
                         (data_type,pIVar3->DragCurrentAccum + fVar10,v_min,v_max,true,fVar11,0.0);
      dVar1 = (double)fVar10;
    }
    if ((flags & 0x40U) == 0 && uVar6 == 8) {
      dVar14 = RoundScalarWithFormatT<double>(format,data_type,dVar14);
    }
    pIVar3->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      dVar1 = dVar14 - *v;
    }
    else {
      fVar11 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar14,v_min,v_max,true,fVar11,0.0);
      dVar1 = (double)fVar11 - dVar1;
    }
    pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (float)dVar1;
    dVar14 = (double)(~-(ulong)(dVar14 == 0.0) & (ulong)dVar14);
    dVar1 = *v;
    if (v_min < v_max) {
      if ((dVar1 != dVar14) || (NAN(dVar1) || NAN(dVar14))) {
        if ((v_min < v_max & (byte)((uint)flags >> 8) & 1) == 0) {
          if ((dVar14 < v_min) || (((uVar6 != 8 && (dVar1 < dVar14)) && (fVar13 < 0.0)))) {
            dVar14 = v_min;
          }
          if ((v_max < dVar14) || (((uVar6 != 8 && (dVar14 < dVar1)) && (0.0 < fVar13)))) {
            dVar14 = v_max;
          }
        }
        else {
          if (uVar6 == 8) {
            dVar12 = 0.0;
          }
          else {
            dVar12 = 1.0;
          }
          dVar14 = (double)(~-(ulong)(dVar14 < v_min) & (ulong)dVar14 |
                           (ulong)(dVar2 + dVar12 + dVar14) & -(ulong)(dVar14 < v_min));
          if (v_max < dVar14) {
            dVar14 = dVar14 - (dVar2 + dVar12);
          }
        }
      }
    }
    if ((dVar1 != dVar14) || (NAN(dVar1) || NAN(dVar14))) {
      *v = dVar14;
      bVar4 = true;
    }
    else {
      bVar4 = (bool)(-(dVar1 != dVar14) & 1);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_bounded = (v_min < v_max);
    const bool is_wrapped = is_bounded && (flags & ImGuiSliderFlags_WrapAround);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_bounded && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
        const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
        const float tweak_factor = tweak_slow ? 1.0f / 10.0f : tweak_fast ? 10.0f : 1.0f;
        adjust_delta = GetNavTweakPressedAmount(axis) * tweak_factor;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    const bool is_just_activated = g.ActiveIdIsJustActivated;
    const bool is_already_past_limits_and_pushing_outward = is_bounded && !is_wrapped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    if (*v != v_cur && is_bounded)
    {
        if (is_wrapped)
        {
            // Wrap values
            if (v_cur < v_min)
                v_cur += v_max - v_min + (is_floating_point ? 0 : 1);
            if (v_cur > v_max)
                v_cur -= v_max - v_min + (is_floating_point ? 0 : 1);
        }
        else
        {
            // Clamp values + handle overflow/wrap-around for integer types.
            if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
                v_cur = v_min;
            if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
                v_cur = v_max;
        }
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}